

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# row_gather.cpp
# Opt level: O2

void duckdb::RowOperations::Gather
               (Vector *rows,SelectionVector *row_sel,Vector *col,SelectionVector *col_sel,
               idx_t count,RowLayout *layout,idx_t col_no,idx_t build_size,data_ptr_t heap_ptr)

{
  PhysicalType PVar1;
  idx_t iVar2;
  value_type vVar3;
  data_ptr_t pdVar4;
  long lVar5;
  undefined8 uVar6;
  idx_t i;
  const_reference pvVar7;
  ulong uVar8;
  InternalException *this;
  data_ptr_t pdVar9;
  idx_t i_2;
  idx_t i_1;
  ValidityMask *pVVar10;
  ulong uVar11;
  long lVar12;
  ulong uVar13;
  byte bVar14;
  undefined1 local_80 [40];
  unique_ptr<unsigned_char_*[],_std::default_delete<unsigned_char_*>,_false> mask_locations;
  unique_ptr<unsigned_char_*[],_std::default_delete<unsigned_char_*>,_false> data_locations;
  idx_t local_40;
  idx_t local_38;
  
  Vector::SetVectorType(col,FLAT_VECTOR);
  PVar1 = (col->type).physical_type_;
  bVar14 = (byte)col_no;
  switch(PVar1) {
  case BOOL:
  case INT8:
    pvVar7 = vector<unsigned_long,_true>::get<true>(&layout->offsets,col_no);
    vVar3 = *pvVar7;
    pdVar4 = rows->data;
    pdVar9 = col->data;
    FlatVector::VerifyFlatVector(col);
    pVVar10 = &col->validity;
    for (uVar11 = 0; count != uVar11; uVar11 = uVar11 + 1) {
      uVar8 = uVar11;
      if (row_sel->sel_vector != (sel_t *)0x0) {
        uVar8 = (ulong)row_sel->sel_vector[uVar11];
      }
      uVar13 = uVar11;
      if (col_sel->sel_vector != (sel_t *)0x0) {
        uVar13 = (ulong)col_sel->sel_vector[uVar11];
      }
      local_80._0_8_ = *(undefined8 *)(pdVar4 + uVar8 * 8);
      pdVar9[uVar13] = *(data_t *)(local_80._0_8_ + vVar3);
      local_80._24_8_ =
           ((long)(layout->types).
                  super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>.
                  super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>.
                  _M_impl.super__Vector_impl_data._M_finish -
           (long)(layout->types).
                 super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>.
                 super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>.
                 _M_impl.super__Vector_impl_data._M_start) / 0x18;
      local_80._8_8_ = (data_ptr_t *)0x0;
      local_80._16_8_ = 0;
      if ((1 << (bVar14 & 7) & (uint)*(byte *)(local_80._0_8_ + (col_no >> 3))) == 0) {
        if ((0x800 < build_size) &&
           ((pVVar10->super_TemplatedValidityMask<unsigned_long>).validity_mask ==
            (unsigned_long *)0x0)) {
          TemplatedValidityMask<unsigned_long>::Initialize
                    (&pVVar10->super_TemplatedValidityMask<unsigned_long>,build_size);
        }
        TemplatedValidityMask<unsigned_long>::SetInvalid
                  (&pVVar10->super_TemplatedValidityMask<unsigned_long>,uVar13);
      }
      ::std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_80 + 0x10));
    }
    break;
  case UINT8:
    pvVar7 = vector<unsigned_long,_true>::get<true>(&layout->offsets,col_no);
    vVar3 = *pvVar7;
    pdVar4 = rows->data;
    pdVar9 = col->data;
    FlatVector::VerifyFlatVector(col);
    pVVar10 = &col->validity;
    for (uVar11 = 0; count != uVar11; uVar11 = uVar11 + 1) {
      uVar8 = uVar11;
      if (row_sel->sel_vector != (sel_t *)0x0) {
        uVar8 = (ulong)row_sel->sel_vector[uVar11];
      }
      uVar13 = uVar11;
      if (col_sel->sel_vector != (sel_t *)0x0) {
        uVar13 = (ulong)col_sel->sel_vector[uVar11];
      }
      local_80._0_8_ = *(undefined8 *)(pdVar4 + uVar8 * 8);
      pdVar9[uVar13] = *(data_t *)(local_80._0_8_ + vVar3);
      local_80._24_8_ =
           ((long)(layout->types).
                  super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>.
                  super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>.
                  _M_impl.super__Vector_impl_data._M_finish -
           (long)(layout->types).
                 super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>.
                 super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>.
                 _M_impl.super__Vector_impl_data._M_start) / 0x18;
      local_80._8_8_ = (data_ptr_t *)0x0;
      local_80._16_8_ = 0;
      if ((1 << (bVar14 & 7) & (uint)*(byte *)(local_80._0_8_ + (col_no >> 3))) == 0) {
        if ((0x800 < build_size) &&
           ((pVVar10->super_TemplatedValidityMask<unsigned_long>).validity_mask ==
            (unsigned_long *)0x0)) {
          TemplatedValidityMask<unsigned_long>::Initialize
                    (&pVVar10->super_TemplatedValidityMask<unsigned_long>,build_size);
        }
        TemplatedValidityMask<unsigned_long>::SetInvalid
                  (&pVVar10->super_TemplatedValidityMask<unsigned_long>,uVar13);
      }
      ::std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_80 + 0x10));
    }
    break;
  case UINT16:
    pvVar7 = vector<unsigned_long,_true>::get<true>(&layout->offsets,col_no);
    vVar3 = *pvVar7;
    pdVar4 = rows->data;
    pdVar9 = col->data;
    FlatVector::VerifyFlatVector(col);
    pVVar10 = &col->validity;
    for (uVar11 = 0; count != uVar11; uVar11 = uVar11 + 1) {
      uVar8 = uVar11;
      if (row_sel->sel_vector != (sel_t *)0x0) {
        uVar8 = (ulong)row_sel->sel_vector[uVar11];
      }
      uVar13 = uVar11;
      if (col_sel->sel_vector != (sel_t *)0x0) {
        uVar13 = (ulong)col_sel->sel_vector[uVar11];
      }
      local_80._0_8_ = *(undefined8 *)(pdVar4 + uVar8 * 8);
      *(undefined2 *)(pdVar9 + uVar13 * 2) = *(undefined2 *)(local_80._0_8_ + vVar3);
      local_80._24_8_ =
           ((long)(layout->types).
                  super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>.
                  super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>.
                  _M_impl.super__Vector_impl_data._M_finish -
           (long)(layout->types).
                 super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>.
                 super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>.
                 _M_impl.super__Vector_impl_data._M_start) / 0x18;
      local_80._8_8_ = (data_ptr_t *)0x0;
      local_80._16_8_ = 0;
      if ((1 << (bVar14 & 7) & (uint)*(byte *)(local_80._0_8_ + (col_no >> 3))) == 0) {
        if ((0x800 < build_size) &&
           ((pVVar10->super_TemplatedValidityMask<unsigned_long>).validity_mask ==
            (unsigned_long *)0x0)) {
          TemplatedValidityMask<unsigned_long>::Initialize
                    (&pVVar10->super_TemplatedValidityMask<unsigned_long>,build_size);
        }
        TemplatedValidityMask<unsigned_long>::SetInvalid
                  (&pVVar10->super_TemplatedValidityMask<unsigned_long>,uVar13);
      }
      ::std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_80 + 0x10));
    }
    break;
  case INT16:
    pvVar7 = vector<unsigned_long,_true>::get<true>(&layout->offsets,col_no);
    vVar3 = *pvVar7;
    pdVar4 = rows->data;
    pdVar9 = col->data;
    FlatVector::VerifyFlatVector(col);
    pVVar10 = &col->validity;
    for (uVar11 = 0; count != uVar11; uVar11 = uVar11 + 1) {
      uVar8 = uVar11;
      if (row_sel->sel_vector != (sel_t *)0x0) {
        uVar8 = (ulong)row_sel->sel_vector[uVar11];
      }
      uVar13 = uVar11;
      if (col_sel->sel_vector != (sel_t *)0x0) {
        uVar13 = (ulong)col_sel->sel_vector[uVar11];
      }
      local_80._0_8_ = *(undefined8 *)(pdVar4 + uVar8 * 8);
      *(undefined2 *)(pdVar9 + uVar13 * 2) = *(undefined2 *)(local_80._0_8_ + vVar3);
      local_80._24_8_ =
           ((long)(layout->types).
                  super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>.
                  super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>.
                  _M_impl.super__Vector_impl_data._M_finish -
           (long)(layout->types).
                 super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>.
                 super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>.
                 _M_impl.super__Vector_impl_data._M_start) / 0x18;
      local_80._8_8_ = (data_ptr_t *)0x0;
      local_80._16_8_ = 0;
      if ((1 << (bVar14 & 7) & (uint)*(byte *)(local_80._0_8_ + (col_no >> 3))) == 0) {
        if ((0x800 < build_size) &&
           ((pVVar10->super_TemplatedValidityMask<unsigned_long>).validity_mask ==
            (unsigned_long *)0x0)) {
          TemplatedValidityMask<unsigned_long>::Initialize
                    (&pVVar10->super_TemplatedValidityMask<unsigned_long>,build_size);
        }
        TemplatedValidityMask<unsigned_long>::SetInvalid
                  (&pVVar10->super_TemplatedValidityMask<unsigned_long>,uVar13);
      }
      ::std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_80 + 0x10));
    }
    break;
  case UINT32:
    pvVar7 = vector<unsigned_long,_true>::get<true>(&layout->offsets,col_no);
    vVar3 = *pvVar7;
    pdVar4 = rows->data;
    pdVar9 = col->data;
    FlatVector::VerifyFlatVector(col);
    pVVar10 = &col->validity;
    for (uVar11 = 0; count != uVar11; uVar11 = uVar11 + 1) {
      uVar8 = uVar11;
      if (row_sel->sel_vector != (sel_t *)0x0) {
        uVar8 = (ulong)row_sel->sel_vector[uVar11];
      }
      uVar13 = uVar11;
      if (col_sel->sel_vector != (sel_t *)0x0) {
        uVar13 = (ulong)col_sel->sel_vector[uVar11];
      }
      local_80._0_8_ = *(undefined8 *)(pdVar4 + uVar8 * 8);
      *(undefined4 *)(pdVar9 + uVar13 * 4) = *(undefined4 *)(local_80._0_8_ + vVar3);
      local_80._24_8_ =
           ((long)(layout->types).
                  super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>.
                  super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>.
                  _M_impl.super__Vector_impl_data._M_finish -
           (long)(layout->types).
                 super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>.
                 super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>.
                 _M_impl.super__Vector_impl_data._M_start) / 0x18;
      local_80._8_8_ = (data_ptr_t *)0x0;
      local_80._16_8_ = 0;
      if ((1 << (bVar14 & 7) & (uint)*(byte *)(local_80._0_8_ + (col_no >> 3))) == 0) {
        if ((0x800 < build_size) &&
           ((pVVar10->super_TemplatedValidityMask<unsigned_long>).validity_mask ==
            (unsigned_long *)0x0)) {
          TemplatedValidityMask<unsigned_long>::Initialize
                    (&pVVar10->super_TemplatedValidityMask<unsigned_long>,build_size);
        }
        TemplatedValidityMask<unsigned_long>::SetInvalid
                  (&pVVar10->super_TemplatedValidityMask<unsigned_long>,uVar13);
      }
      ::std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_80 + 0x10));
    }
    break;
  case INT32:
    pvVar7 = vector<unsigned_long,_true>::get<true>(&layout->offsets,col_no);
    vVar3 = *pvVar7;
    pdVar4 = rows->data;
    pdVar9 = col->data;
    FlatVector::VerifyFlatVector(col);
    pVVar10 = &col->validity;
    for (uVar11 = 0; count != uVar11; uVar11 = uVar11 + 1) {
      uVar8 = uVar11;
      if (row_sel->sel_vector != (sel_t *)0x0) {
        uVar8 = (ulong)row_sel->sel_vector[uVar11];
      }
      uVar13 = uVar11;
      if (col_sel->sel_vector != (sel_t *)0x0) {
        uVar13 = (ulong)col_sel->sel_vector[uVar11];
      }
      local_80._0_8_ = *(undefined8 *)(pdVar4 + uVar8 * 8);
      *(undefined4 *)(pdVar9 + uVar13 * 4) = *(undefined4 *)(local_80._0_8_ + vVar3);
      local_80._24_8_ =
           ((long)(layout->types).
                  super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>.
                  super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>.
                  _M_impl.super__Vector_impl_data._M_finish -
           (long)(layout->types).
                 super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>.
                 super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>.
                 _M_impl.super__Vector_impl_data._M_start) / 0x18;
      local_80._8_8_ = (data_ptr_t *)0x0;
      local_80._16_8_ = 0;
      if ((1 << (bVar14 & 7) & (uint)*(byte *)(local_80._0_8_ + (col_no >> 3))) == 0) {
        if ((0x800 < build_size) &&
           ((pVVar10->super_TemplatedValidityMask<unsigned_long>).validity_mask ==
            (unsigned_long *)0x0)) {
          TemplatedValidityMask<unsigned_long>::Initialize
                    (&pVVar10->super_TemplatedValidityMask<unsigned_long>,build_size);
        }
        TemplatedValidityMask<unsigned_long>::SetInvalid
                  (&pVVar10->super_TemplatedValidityMask<unsigned_long>,uVar13);
      }
      ::std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_80 + 0x10));
    }
    break;
  case UINT64:
    pvVar7 = vector<unsigned_long,_true>::get<true>(&layout->offsets,col_no);
    vVar3 = *pvVar7;
    pdVar4 = rows->data;
    pdVar9 = col->data;
    FlatVector::VerifyFlatVector(col);
    pVVar10 = &col->validity;
    for (uVar11 = 0; count != uVar11; uVar11 = uVar11 + 1) {
      uVar8 = uVar11;
      if (row_sel->sel_vector != (sel_t *)0x0) {
        uVar8 = (ulong)row_sel->sel_vector[uVar11];
      }
      uVar13 = uVar11;
      if (col_sel->sel_vector != (sel_t *)0x0) {
        uVar13 = (ulong)col_sel->sel_vector[uVar11];
      }
      local_80._0_8_ = *(undefined8 *)(pdVar4 + uVar8 * 8);
      *(undefined8 *)(pdVar9 + uVar13 * 8) = *(undefined8 *)(local_80._0_8_ + vVar3);
      local_80._24_8_ =
           ((long)(layout->types).
                  super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>.
                  super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>.
                  _M_impl.super__Vector_impl_data._M_finish -
           (long)(layout->types).
                 super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>.
                 super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>.
                 _M_impl.super__Vector_impl_data._M_start) / 0x18;
      local_80._8_8_ = (data_ptr_t *)0x0;
      local_80._16_8_ = 0;
      if ((1 << (bVar14 & 7) & (uint)*(byte *)(local_80._0_8_ + (col_no >> 3))) == 0) {
        if ((0x800 < build_size) &&
           ((pVVar10->super_TemplatedValidityMask<unsigned_long>).validity_mask ==
            (unsigned_long *)0x0)) {
          TemplatedValidityMask<unsigned_long>::Initialize
                    (&pVVar10->super_TemplatedValidityMask<unsigned_long>,build_size);
        }
        TemplatedValidityMask<unsigned_long>::SetInvalid
                  (&pVVar10->super_TemplatedValidityMask<unsigned_long>,uVar13);
      }
      ::std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_80 + 0x10));
    }
    break;
  case INT64:
    pvVar7 = vector<unsigned_long,_true>::get<true>(&layout->offsets,col_no);
    vVar3 = *pvVar7;
    pdVar4 = rows->data;
    pdVar9 = col->data;
    FlatVector::VerifyFlatVector(col);
    pVVar10 = &col->validity;
    for (uVar11 = 0; count != uVar11; uVar11 = uVar11 + 1) {
      uVar8 = uVar11;
      if (row_sel->sel_vector != (sel_t *)0x0) {
        uVar8 = (ulong)row_sel->sel_vector[uVar11];
      }
      uVar13 = uVar11;
      if (col_sel->sel_vector != (sel_t *)0x0) {
        uVar13 = (ulong)col_sel->sel_vector[uVar11];
      }
      local_80._0_8_ = *(undefined8 *)(pdVar4 + uVar8 * 8);
      *(undefined8 *)(pdVar9 + uVar13 * 8) = *(undefined8 *)(local_80._0_8_ + vVar3);
      local_80._24_8_ =
           ((long)(layout->types).
                  super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>.
                  super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>.
                  _M_impl.super__Vector_impl_data._M_finish -
           (long)(layout->types).
                 super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>.
                 super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>.
                 _M_impl.super__Vector_impl_data._M_start) / 0x18;
      local_80._8_8_ = (data_ptr_t *)0x0;
      local_80._16_8_ = 0;
      if ((1 << (bVar14 & 7) & (uint)*(byte *)(local_80._0_8_ + (col_no >> 3))) == 0) {
        if ((0x800 < build_size) &&
           ((pVVar10->super_TemplatedValidityMask<unsigned_long>).validity_mask ==
            (unsigned_long *)0x0)) {
          TemplatedValidityMask<unsigned_long>::Initialize
                    (&pVVar10->super_TemplatedValidityMask<unsigned_long>,build_size);
        }
        TemplatedValidityMask<unsigned_long>::SetInvalid
                  (&pVVar10->super_TemplatedValidityMask<unsigned_long>,uVar13);
      }
      ::std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_80 + 0x10));
    }
    break;
  case UINT64|UINT8:
  case DOUBLE|BOOL:
  case DOUBLE|UINT8:
  case DOUBLE|INT8:
  case 0x10:
  case 0x11:
  case 0x12:
  case 0x13:
  case 0x14:
  case 0x16:
  case STRUCT|BOOL:
  case STRUCT|UINT8:
  case STRUCT|INT8:
  case STRUCT|UINT16:
switchD_008e0ab3_caseD_a:
    this = (InternalException *)__cxa_allocate_exception(0x10);
    ::std::__cxx11::string::string
              ((string *)local_80,"Unimplemented type for RowOperations::Gather",
               (allocator *)&local_40);
    InternalException::InternalException(this,(string *)local_80);
    __cxa_throw(this,&InternalException::typeinfo,::std::runtime_error::~runtime_error);
  case FLOAT:
    pvVar7 = vector<unsigned_long,_true>::get<true>(&layout->offsets,col_no);
    vVar3 = *pvVar7;
    pdVar4 = rows->data;
    pdVar9 = col->data;
    FlatVector::VerifyFlatVector(col);
    pVVar10 = &col->validity;
    for (uVar11 = 0; count != uVar11; uVar11 = uVar11 + 1) {
      uVar8 = uVar11;
      if (row_sel->sel_vector != (sel_t *)0x0) {
        uVar8 = (ulong)row_sel->sel_vector[uVar11];
      }
      uVar13 = uVar11;
      if (col_sel->sel_vector != (sel_t *)0x0) {
        uVar13 = (ulong)col_sel->sel_vector[uVar11];
      }
      local_80._0_8_ = *(undefined8 *)(pdVar4 + uVar8 * 8);
      *(undefined4 *)(pdVar9 + uVar13 * 4) = *(undefined4 *)(local_80._0_8_ + vVar3);
      local_80._24_8_ =
           ((long)(layout->types).
                  super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>.
                  super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>.
                  _M_impl.super__Vector_impl_data._M_finish -
           (long)(layout->types).
                 super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>.
                 super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>.
                 _M_impl.super__Vector_impl_data._M_start) / 0x18;
      local_80._8_8_ = (data_ptr_t *)0x0;
      local_80._16_8_ = 0;
      if ((1 << (bVar14 & 7) & (uint)*(byte *)(local_80._0_8_ + (col_no >> 3))) == 0) {
        if ((0x800 < build_size) &&
           ((pVVar10->super_TemplatedValidityMask<unsigned_long>).validity_mask ==
            (unsigned_long *)0x0)) {
          TemplatedValidityMask<unsigned_long>::Initialize
                    (&pVVar10->super_TemplatedValidityMask<unsigned_long>,build_size);
        }
        TemplatedValidityMask<unsigned_long>::SetInvalid
                  (&pVVar10->super_TemplatedValidityMask<unsigned_long>,uVar13);
      }
      ::std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_80 + 0x10));
    }
    break;
  case DOUBLE:
    pvVar7 = vector<unsigned_long,_true>::get<true>(&layout->offsets,col_no);
    vVar3 = *pvVar7;
    pdVar4 = rows->data;
    pdVar9 = col->data;
    FlatVector::VerifyFlatVector(col);
    pVVar10 = &col->validity;
    for (uVar11 = 0; count != uVar11; uVar11 = uVar11 + 1) {
      uVar8 = uVar11;
      if (row_sel->sel_vector != (sel_t *)0x0) {
        uVar8 = (ulong)row_sel->sel_vector[uVar11];
      }
      uVar13 = uVar11;
      if (col_sel->sel_vector != (sel_t *)0x0) {
        uVar13 = (ulong)col_sel->sel_vector[uVar11];
      }
      local_80._0_8_ = *(undefined8 *)(pdVar4 + uVar8 * 8);
      *(undefined8 *)(pdVar9 + uVar13 * 8) = *(undefined8 *)(local_80._0_8_ + vVar3);
      local_80._24_8_ =
           ((long)(layout->types).
                  super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>.
                  super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>.
                  _M_impl.super__Vector_impl_data._M_finish -
           (long)(layout->types).
                 super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>.
                 super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>.
                 _M_impl.super__Vector_impl_data._M_start) / 0x18;
      local_80._8_8_ = (data_ptr_t *)0x0;
      local_80._16_8_ = 0;
      if ((1 << (bVar14 & 7) & (uint)*(byte *)(local_80._0_8_ + (col_no >> 3))) == 0) {
        if ((0x800 < build_size) &&
           ((pVVar10->super_TemplatedValidityMask<unsigned_long>).validity_mask ==
            (unsigned_long *)0x0)) {
          TemplatedValidityMask<unsigned_long>::Initialize
                    (&pVVar10->super_TemplatedValidityMask<unsigned_long>,build_size);
        }
        TemplatedValidityMask<unsigned_long>::SetInvalid
                  (&pVVar10->super_TemplatedValidityMask<unsigned_long>,uVar13);
      }
      ::std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_80 + 0x10));
    }
    break;
  case INTERVAL:
    pvVar7 = vector<unsigned_long,_true>::get<true>(&layout->offsets,col_no);
    vVar3 = *pvVar7;
    pdVar4 = rows->data;
    pdVar9 = col->data;
    FlatVector::VerifyFlatVector(col);
    pVVar10 = &col->validity;
    for (uVar11 = 0; count != uVar11; uVar11 = uVar11 + 1) {
      uVar8 = uVar11;
      if (row_sel->sel_vector != (sel_t *)0x0) {
        uVar8 = (ulong)row_sel->sel_vector[uVar11];
      }
      uVar13 = uVar11;
      if (col_sel->sel_vector != (sel_t *)0x0) {
        uVar13 = (ulong)col_sel->sel_vector[uVar11];
      }
      local_80._0_8_ = *(undefined8 *)(pdVar4 + uVar8 * 8);
      uVar6 = *(undefined8 *)((data_ptr_t)(local_80._0_8_ + vVar3) + 8);
      *(undefined8 *)(pdVar9 + uVar13 * 0x10) = *(undefined8 *)(local_80._0_8_ + vVar3);
      *(undefined8 *)(pdVar9 + uVar13 * 0x10 + 8) = uVar6;
      local_80._24_8_ =
           ((long)(layout->types).
                  super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>.
                  super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>.
                  _M_impl.super__Vector_impl_data._M_finish -
           (long)(layout->types).
                 super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>.
                 super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>.
                 _M_impl.super__Vector_impl_data._M_start) / 0x18;
      local_80._8_8_ = (data_ptr_t *)0x0;
      local_80._16_8_ = 0;
      if ((1 << (bVar14 & 7) & (uint)*(byte *)(local_80._0_8_ + (col_no >> 3))) == 0) {
        if ((0x800 < build_size) &&
           ((pVVar10->super_TemplatedValidityMask<unsigned_long>).validity_mask ==
            (unsigned_long *)0x0)) {
          TemplatedValidityMask<unsigned_long>::Initialize
                    (&pVVar10->super_TemplatedValidityMask<unsigned_long>,build_size);
        }
        TemplatedValidityMask<unsigned_long>::SetInvalid
                  (&pVVar10->super_TemplatedValidityMask<unsigned_long>,uVar13);
      }
      ::std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_80 + 0x10));
    }
    break;
  case LIST:
  case STRUCT:
  case ARRAY:
    local_40 = count;
    pvVar7 = vector<unsigned_long,_true>::get<true>(&layout->offsets,col_no);
    vVar3 = *pvVar7;
    iVar2 = layout->heap_pointer_offset;
    pdVar4 = rows->data;
    make_unsafe_uniq_array_uninitialized<unsigned_char*>((duckdb *)&data_locations,count);
    make_unsafe_uniq_array_uninitialized<unsigned_char*>((duckdb *)&mask_locations,count);
    for (uVar11 = 0; count != uVar11; uVar11 = uVar11 + 1) {
      uVar8 = uVar11;
      if (row_sel->sel_vector != (sel_t *)0x0) {
        uVar8 = (ulong)row_sel->sel_vector[uVar11];
      }
      lVar5 = *(long *)(pdVar4 + uVar8 * 8);
      *(long *)((long)mask_locations.
                      super_unique_ptr<unsigned_char_*[],_std::default_delete<unsigned_char_*[]>_>.
                      _M_t.
                      super___uniq_ptr_impl<unsigned_char_*,_std::default_delete<unsigned_char_*[]>_>
                      ._M_t.
                      super__Tuple_impl<0UL,_unsigned_char_**,_std::default_delete<unsigned_char_*[]>_>
                      .super__Head_base<0UL,_unsigned_char_**,_false>._M_head_impl + uVar11 * 8) =
           lVar5;
      if (heap_ptr == (data_ptr_t)0x0) {
        pdVar9 = *(data_ptr_t *)(lVar5 + vVar3);
      }
      else {
        pdVar9 = heap_ptr + *(long *)(lVar5 + vVar3) + *(long *)(lVar5 + iVar2);
      }
      *(data_ptr_t *)
       ((long)data_locations.
              super_unique_ptr<unsigned_char_*[],_std::default_delete<unsigned_char_*[]>_>._M_t.
              super___uniq_ptr_impl<unsigned_char_*,_std::default_delete<unsigned_char_*[]>_>._M_t.
              super__Tuple_impl<0UL,_unsigned_char_**,_std::default_delete<unsigned_char_*[]>_>.
              super__Head_base<0UL,_unsigned_char_**,_false>._M_head_impl + uVar11 * 8) = pdVar9;
    }
    NestedValidity::NestedValidity
              ((NestedValidity *)local_80,
               (data_ptr_t *)
               mask_locations.
               super_unique_ptr<unsigned_char_*[],_std::default_delete<unsigned_char_*[]>_>._M_t.
               super___uniq_ptr_impl<unsigned_char_*,_std::default_delete<unsigned_char_*[]>_>._M_t.
               super__Tuple_impl<0UL,_unsigned_char_**,_std::default_delete<unsigned_char_*[]>_>.
               super__Head_base<0UL,_unsigned_char_**,_false>._M_head_impl,col_no);
    HeapGather(col,&local_40,col_sel,
               (data_ptr_t *)
               data_locations.
               super_unique_ptr<unsigned_char_*[],_std::default_delete<unsigned_char_*[]>_>._M_t.
               super___uniq_ptr_impl<unsigned_char_*,_std::default_delete<unsigned_char_*[]>_>._M_t.
               super__Tuple_impl<0UL,_unsigned_char_**,_std::default_delete<unsigned_char_*[]>_>.
               super__Head_base<0UL,_unsigned_char_**,_false>._M_head_impl,
               (NestedValidity *)local_80);
    ::std::unique_ptr<unsigned_char_*[],_std::default_delete<unsigned_char_*[]>_>::~unique_ptr
              (&mask_locations.
                super_unique_ptr<unsigned_char_*[],_std::default_delete<unsigned_char_*[]>_>);
    ::std::unique_ptr<unsigned_char_*[],_std::default_delete<unsigned_char_*[]>_>::~unique_ptr
              (&data_locations.
                super_unique_ptr<unsigned_char_*[],_std::default_delete<unsigned_char_*[]>_>);
    break;
  default:
    if (PVar1 == VARCHAR) {
      pvVar7 = vector<unsigned_long,_true>::get<true>(&layout->offsets,col_no);
      vVar3 = *pvVar7;
      local_38 = layout->heap_pointer_offset;
      pdVar4 = rows->data;
      pdVar9 = col->data;
      FlatVector::VerifyFlatVector(col);
      pVVar10 = &col->validity;
      for (uVar11 = 0; count != uVar11; uVar11 = uVar11 + 1) {
        uVar8 = uVar11;
        if (row_sel->sel_vector != (sel_t *)0x0) {
          uVar8 = (ulong)row_sel->sel_vector[uVar11];
        }
        uVar13 = uVar11;
        if (col_sel->sel_vector != (sel_t *)0x0) {
          uVar13 = (ulong)col_sel->sel_vector[uVar11];
        }
        local_80._0_8_ = *(undefined8 *)(pdVar4 + uVar8 * 8);
        lVar5 = *(long *)(local_80._0_8_ + vVar3 + 8);
        lVar12 = uVar13 * 0x10;
        *(undefined8 *)(pdVar9 + lVar12) = *(undefined8 *)(local_80._0_8_ + vVar3);
        *(long *)(pdVar9 + lVar12 + 8) = lVar5;
        local_80._24_8_ =
             ((long)(layout->types).
                    super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>.
                    super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>.
                    _M_impl.super__Vector_impl_data._M_finish -
             (long)(layout->types).
                   super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>.
                   super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>.
                   _M_impl.super__Vector_impl_data._M_start) / 0x18;
        local_80._8_8_ = (data_ptr_t *)0x0;
        local_80._16_8_ = 0;
        if ((1 << (bVar14 & 7) & (uint)*(byte *)(local_80._0_8_ + (col_no >> 3))) == 0) {
          if ((0x800 < build_size) &&
             ((pVVar10->super_TemplatedValidityMask<unsigned_long>).validity_mask ==
              (unsigned_long *)0x0)) {
            TemplatedValidityMask<unsigned_long>::Initialize
                      (&pVVar10->super_TemplatedValidityMask<unsigned_long>,build_size);
          }
          TemplatedValidityMask<unsigned_long>::SetInvalid
                    (&pVVar10->super_TemplatedValidityMask<unsigned_long>,uVar13);
        }
        else if ((heap_ptr != (data_ptr_t)0x0) && (0xc < *(uint *)(local_80._0_8_ + vVar3))) {
          *(data_ptr_t *)(pdVar9 + lVar12 + 8) =
               heap_ptr + lVar5 + *(long *)(local_80._0_8_ + local_38);
        }
        ::std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                  ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_80 + 0x10));
      }
    }
    else if (PVar1 == UINT128) {
      pvVar7 = vector<unsigned_long,_true>::get<true>(&layout->offsets,col_no);
      vVar3 = *pvVar7;
      pdVar4 = rows->data;
      pdVar9 = col->data;
      FlatVector::VerifyFlatVector(col);
      pVVar10 = &col->validity;
      for (uVar11 = 0; count != uVar11; uVar11 = uVar11 + 1) {
        uVar8 = uVar11;
        if (row_sel->sel_vector != (sel_t *)0x0) {
          uVar8 = (ulong)row_sel->sel_vector[uVar11];
        }
        uVar13 = uVar11;
        if (col_sel->sel_vector != (sel_t *)0x0) {
          uVar13 = (ulong)col_sel->sel_vector[uVar11];
        }
        local_80._0_8_ = *(undefined8 *)(pdVar4 + uVar8 * 8);
        uVar6 = *(undefined8 *)((data_ptr_t)(local_80._0_8_ + vVar3) + 8);
        *(undefined8 *)(pdVar9 + uVar13 * 0x10) = *(undefined8 *)(local_80._0_8_ + vVar3);
        *(undefined8 *)(pdVar9 + uVar13 * 0x10 + 8) = uVar6;
        local_80._24_8_ =
             ((long)(layout->types).
                    super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>.
                    super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>.
                    _M_impl.super__Vector_impl_data._M_finish -
             (long)(layout->types).
                   super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>.
                   super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>.
                   _M_impl.super__Vector_impl_data._M_start) / 0x18;
        local_80._8_8_ = (data_ptr_t *)0x0;
        local_80._16_8_ = 0;
        if ((1 << (bVar14 & 7) & (uint)*(byte *)(local_80._0_8_ + (col_no >> 3))) == 0) {
          if ((0x800 < build_size) &&
             ((pVVar10->super_TemplatedValidityMask<unsigned_long>).validity_mask ==
              (unsigned_long *)0x0)) {
            TemplatedValidityMask<unsigned_long>::Initialize
                      (&pVVar10->super_TemplatedValidityMask<unsigned_long>,build_size);
          }
          TemplatedValidityMask<unsigned_long>::SetInvalid
                    (&pVVar10->super_TemplatedValidityMask<unsigned_long>,uVar13);
        }
        ::std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                  ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_80 + 0x10));
      }
    }
    else {
      if (PVar1 != INT128) goto switchD_008e0ab3_caseD_a;
      pvVar7 = vector<unsigned_long,_true>::get<true>(&layout->offsets,col_no);
      vVar3 = *pvVar7;
      pdVar4 = rows->data;
      pdVar9 = col->data;
      FlatVector::VerifyFlatVector(col);
      pVVar10 = &col->validity;
      for (uVar11 = 0; count != uVar11; uVar11 = uVar11 + 1) {
        uVar8 = uVar11;
        if (row_sel->sel_vector != (sel_t *)0x0) {
          uVar8 = (ulong)row_sel->sel_vector[uVar11];
        }
        uVar13 = uVar11;
        if (col_sel->sel_vector != (sel_t *)0x0) {
          uVar13 = (ulong)col_sel->sel_vector[uVar11];
        }
        local_80._0_8_ = *(undefined8 *)(pdVar4 + uVar8 * 8);
        uVar6 = *(undefined8 *)((data_ptr_t)(local_80._0_8_ + vVar3) + 8);
        *(undefined8 *)(pdVar9 + uVar13 * 0x10) = *(undefined8 *)(local_80._0_8_ + vVar3);
        *(undefined8 *)(pdVar9 + uVar13 * 0x10 + 8) = uVar6;
        local_80._24_8_ =
             ((long)(layout->types).
                    super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>.
                    super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>.
                    _M_impl.super__Vector_impl_data._M_finish -
             (long)(layout->types).
                   super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>.
                   super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>.
                   _M_impl.super__Vector_impl_data._M_start) / 0x18;
        local_80._8_8_ = (data_ptr_t *)0x0;
        local_80._16_8_ = 0;
        if ((1 << (bVar14 & 7) & (uint)*(byte *)(local_80._0_8_ + (col_no >> 3))) == 0) {
          if ((0x800 < build_size) &&
             ((pVVar10->super_TemplatedValidityMask<unsigned_long>).validity_mask ==
              (unsigned_long *)0x0)) {
            TemplatedValidityMask<unsigned_long>::Initialize
                      (&pVVar10->super_TemplatedValidityMask<unsigned_long>,build_size);
          }
          TemplatedValidityMask<unsigned_long>::SetInvalid
                    (&pVVar10->super_TemplatedValidityMask<unsigned_long>,uVar13);
        }
        ::std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                  ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_80 + 0x10));
      }
    }
  }
  return;
}

Assistant:

void RowOperations::Gather(Vector &rows, const SelectionVector &row_sel, Vector &col, const SelectionVector &col_sel,
                           const idx_t count, const RowLayout &layout, const idx_t col_no, const idx_t build_size,
                           data_ptr_t heap_ptr) {
	D_ASSERT(rows.GetVectorType() == VectorType::FLAT_VECTOR);
	D_ASSERT(rows.GetType().id() == LogicalTypeId::POINTER); // "Cannot gather from non-pointer type!"

	col.SetVectorType(VectorType::FLAT_VECTOR);
	switch (col.GetType().InternalType()) {
	case PhysicalType::UINT8:
		TemplatedGatherLoop<uint8_t>(rows, row_sel, col, col_sel, count, layout, col_no, build_size);
		break;
	case PhysicalType::UINT16:
		TemplatedGatherLoop<uint16_t>(rows, row_sel, col, col_sel, count, layout, col_no, build_size);
		break;
	case PhysicalType::UINT32:
		TemplatedGatherLoop<uint32_t>(rows, row_sel, col, col_sel, count, layout, col_no, build_size);
		break;
	case PhysicalType::UINT64:
		TemplatedGatherLoop<uint64_t>(rows, row_sel, col, col_sel, count, layout, col_no, build_size);
		break;
	case PhysicalType::UINT128:
		TemplatedGatherLoop<uhugeint_t>(rows, row_sel, col, col_sel, count, layout, col_no, build_size);
		break;
	case PhysicalType::BOOL:
	case PhysicalType::INT8:
		TemplatedGatherLoop<int8_t>(rows, row_sel, col, col_sel, count, layout, col_no, build_size);
		break;
	case PhysicalType::INT16:
		TemplatedGatherLoop<int16_t>(rows, row_sel, col, col_sel, count, layout, col_no, build_size);
		break;
	case PhysicalType::INT32:
		TemplatedGatherLoop<int32_t>(rows, row_sel, col, col_sel, count, layout, col_no, build_size);
		break;
	case PhysicalType::INT64:
		TemplatedGatherLoop<int64_t>(rows, row_sel, col, col_sel, count, layout, col_no, build_size);
		break;
	case PhysicalType::INT128:
		TemplatedGatherLoop<hugeint_t>(rows, row_sel, col, col_sel, count, layout, col_no, build_size);
		break;
	case PhysicalType::FLOAT:
		TemplatedGatherLoop<float>(rows, row_sel, col, col_sel, count, layout, col_no, build_size);
		break;
	case PhysicalType::DOUBLE:
		TemplatedGatherLoop<double>(rows, row_sel, col, col_sel, count, layout, col_no, build_size);
		break;
	case PhysicalType::INTERVAL:
		TemplatedGatherLoop<interval_t>(rows, row_sel, col, col_sel, count, layout, col_no, build_size);
		break;
	case PhysicalType::VARCHAR:
		GatherVarchar(rows, row_sel, col, col_sel, count, layout, col_no, build_size, heap_ptr);
		break;
	case PhysicalType::LIST:
	case PhysicalType::STRUCT:
	case PhysicalType::ARRAY:
		GatherNestedVector(rows, row_sel, col, col_sel, count, layout, col_no, heap_ptr);
		break;
	default:
		throw InternalException("Unimplemented type for RowOperations::Gather");
	}
}